

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void initEmptyMultiBox(QList<QLayoutStruct> *chain,int start,int end)

{
  pointer pQVar1;
  ulong uVar2;
  long lVar3;
  
  lVar3 = (long)start;
  uVar2 = lVar3 << 5 | 0x15;
  for (; lVar3 <= end; lVar3 = lVar3 + 1) {
    pQVar1 = QList<QLayoutStruct>::data(chain);
    if ((*(char *)((long)&pQVar1->stretch + uVar2) == '\x01') &&
       (*(int *)((long)pQVar1 + (uVar2 - 0xd)) == 0)) {
      *(undefined4 *)((long)pQVar1 + (uVar2 - 0xd)) = 0xffffff;
    }
    *(undefined1 *)((long)&pQVar1->stretch + uVar2) = 0;
    uVar2 = uVar2 + 0x20;
  }
  return;
}

Assistant:

static void initEmptyMultiBox(QList<QLayoutStruct> &chain, int start, int end)
{
    for (int i = start; i <= end; i++) {
        QLayoutStruct *data = &chain[i];
        if (data->empty && data->maximumSize == 0) // truly empty box
            data->maximumSize = QWIDGETSIZE_MAX;
        data->empty = false;
    }
}